

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

Extension * __thiscall
google::protobuf::internal::ExtensionSet::FindOrNull(ExtensionSet *this,int key)

{
  KeyValue *pKVar1;
  KeyValue *pKVar2;
  Extension *pEVar3;
  int local_14;
  
  if (this->flat_size_ == 0) {
    pEVar3 = (Extension *)0x0;
  }
  else {
    local_14 = key;
    if ((short)this->flat_size_ < 0) {
      pEVar3 = FindOrNullInLargeMap(this,key);
      return pEVar3;
    }
    pKVar1 = flat_begin(this);
    pKVar2 = flat_end(this);
    pKVar1 = std::
             __lower_bound<google::protobuf::internal::ExtensionSet::KeyValue_const*,int,__gnu_cxx::__ops::_Iter_comp_val<google::protobuf::internal::ExtensionSet::KeyValue::FirstComparator>>
                       (pKVar1,pKVar2 + -1,&local_14);
    pEVar3 = (Extension *)0x0;
    if (pKVar1->first == local_14) {
      pEVar3 = &pKVar1->second;
    }
  }
  return pEVar3;
}

Assistant:

const ExtensionSet::Extension* ExtensionSet::FindOrNull(int key) const {
  if (flat_size_ == 0) {
    return nullptr;
  } else if (PROTOBUF_PREDICT_TRUE(!is_large())) {
    auto it = std::lower_bound(flat_begin(), flat_end() - 1, key,
                               KeyValue::FirstComparator());
    return it->first == key ? &it->second : nullptr;
  } else {
    return FindOrNullInLargeMap(key);
  }
}